

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O2

int process_start(char *name,char *part,process_info_t *p,int is_helper)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  FILE *__stream;
  ssize_t sVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  int pipefd [2];
  int local_c4;
  char fdstr [8];
  char *args [16];
  
  pcVar4 = getenv("UV_USE_VALGRIND");
  uVar8 = 0;
  if ((pcVar4 != (char *)0x0 && is_helper == 0) && (iVar1 = atoi(pcVar4), iVar1 != 0)) {
    args[0] = "valgrind";
    args[1] = "--quiet";
    args[2] = "--leak-check=full";
    args[3] = "--show-reachable=yes";
    args[4] = "--error-exitcode=125";
    uVar8 = 5;
  }
  uVar7 = (ulong)(uVar8 * 8);
  *(char **)((long)args + uVar7) = executable_path;
  *(char **)((long)args + uVar7 + 8) = name;
  args[(ulong)uVar8 + 2] = part;
  local_c4 = uVar8 + 4;
  *(undefined8 *)((long)args + uVar7 + 0x18) = 0;
  __stream = tmpfile64();
  iVar1 = fileno(__stream);
  if (__stream == (FILE *)0x0) {
    pcVar4 = "tmpfile";
    goto LAB_0010613f;
  }
  if (is_helper != 0) {
    iVar2 = pipe(pipefd);
    if (iVar2 != 0) {
      pcVar4 = "pipe";
      goto LAB_0010613f;
    }
    snprintf(fdstr,8,"%d",(ulong)(uint)pipefd[1]);
    iVar2 = setenv("UV_TEST_RUNNER_FD",fdstr,1);
    if (iVar2 != 0) {
      pcVar4 = "setenv";
      goto LAB_0010613f;
    }
  }
  p->status = 0;
  p->terminated = 0;
  _Var3 = fork();
  if (_Var3 < 0) {
    pcVar4 = "fork";
  }
  else {
    if (_Var3 == 0) {
      if (is_helper != 0) {
        closefd(pipefd[0]);
      }
      dup2(iVar1,1);
      dup2(iVar1,2);
      execve(args[0],args,_environ);
      perror("execve()");
      _exit(0x7f);
    }
    p->pid = _Var3;
    pcVar4 = strdup(name);
    p->name = pcVar4;
    p->stdout_file = (FILE *)__stream;
    if (is_helper == 0) {
      return 0;
    }
    closefd(pipefd[1]);
    unsetenv("UV_TEST_RUNNER_FD");
    do {
      sVar5 = read(pipefd[0],&local_c4,1);
      if (sVar5 != -1) {
        closefd(pipefd[0]);
        if (0 < sVar5) {
          fwrite("EOF expected but got data.\n",0x1b,1,_stderr);
          return -1;
        }
        return 0;
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    closefd(pipefd[0]);
    pcVar4 = "read";
  }
LAB_0010613f:
  perror(pcVar4);
  return -1;
}

Assistant:

int process_start(char* name, char* part, process_info_t* p, int is_helper) {
  FILE* stdout_file;
  int stdout_fd;
  const char* arg;
  char* args[16];
  int pipefd[2];
  char fdstr[8];
  ssize_t rc;
  int n;
  pid_t pid;

  arg = getenv("UV_USE_VALGRIND");
  n = 0;

  /* Disable valgrind for helpers, it complains about helpers leaking memory.
   * They're killed after the test and as such never get a chance to clean up.
   */
  if (is_helper == 0 && arg != NULL && atoi(arg) != 0) {
    args[n++] = "valgrind";
    args[n++] = "--quiet";
    args[n++] = "--leak-check=full";
    args[n++] = "--show-reachable=yes";
    args[n++] = "--error-exitcode=125";
  }

  args[n++] = executable_path;
  args[n++] = name;
  args[n++] = part;
  args[n++] = NULL;

  stdout_file = tmpfile();
  stdout_fd = fileno(stdout_file);
  if (!stdout_file) {
    perror("tmpfile");
    return -1;
  }

  if (is_helper) {
    if (pipe(pipefd)) {
      perror("pipe");
      return -1;
    }

    snprintf(fdstr, sizeof(fdstr), "%d", pipefd[1]);
    if (setenv("UV_TEST_RUNNER_FD", fdstr, /* overwrite */ 1)) {
      perror("setenv");
      return -1;
    }
  }

  p->terminated = 0;
  p->status = 0;

  pid = fork();

  if (pid < 0) {
    perror("fork");
    return -1;
  }

  if (pid == 0) {
    /* child */
    if (is_helper)
      closefd(pipefd[0]);
    dup2(stdout_fd, STDOUT_FILENO);
    dup2(stdout_fd, STDERR_FILENO);
    execve(args[0], args, environ);
    perror("execve()");
    _exit(127);
  }

  /* parent */
  p->pid = pid;
  p->name = strdup(name);
  p->stdout_file = stdout_file;

  if (!is_helper)
    return 0;

  closefd(pipefd[1]);
  unsetenv("UV_TEST_RUNNER_FD");

  do
    rc = read(pipefd[0], &n, 1);
  while (rc == -1 && errno == EINTR);

  closefd(pipefd[0]);

  if (rc == -1) {
    perror("read");
    return -1;
  }

  if (rc > 0) {
    fprintf(stderr, "EOF expected but got data.\n");
    return -1;
  }

  return 0;
}